

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterFuncPtr,ImPlot::TransformerLogLin>
               (GetterFuncPtr *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  ImPlotPoint IVar13;
  double dVar5;
  float fVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  double extraout_XMM1_Qa_01;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar8 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_48 = getter->Count + -1;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    IVar13.x = (*getter->Getter)(getter->Data,0);
    pIVar9 = GImPlot;
    dVar5 = log10((double)IVar13.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
    pIVar4 = pIVar9->CurrentPlot;
    dVar7 = (pIVar4->XAxis).Range.Min;
    iVar10 = transformer->YAxis;
    IVar2 = pIVar9->PixelRange[iVar10].Min;
    local_3c.y = (float)(pIVar9->My[iVar10] *
                         (extraout_XMM1_Qa_01 - pIVar4->YAxis[iVar10].Range.Min) + (double)IVar2.y);
    local_3c.x = (float)(pIVar9->Mx *
                         (((double)(float)(dVar5 / pIVar9->LogDenX) *
                           ((pIVar4->XAxis).Range.Max - dVar7) + dVar7) - dVar7) + (double)IVar2.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterFuncPtr,ImPlot::TransformerLogLin>>
              ((LineStripRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin> *)local_58,
               DrawList,&pIVar8->CurrentPlot->PlotRect);
  }
  else {
    IVar13.x = (*getter->Getter)(getter->Data,0);
    pIVar9 = GImPlot;
    dVar5 = log10((double)IVar13.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
    pIVar4 = pIVar9->CurrentPlot;
    dVar7 = (pIVar4->XAxis).Range.Min;
    iVar10 = transformer->YAxis;
    IVar2 = pIVar9->PixelRange[iVar10].Min;
    local_58._4_4_ =
         (float)(pIVar9->My[iVar10] * (extraout_XMM1_Qa - pIVar4->YAxis[iVar10].Range.Min) +
                (double)IVar2.y);
    local_58._0_4_ =
         (float)(pIVar9->Mx *
                 (((double)(float)(dVar5 / pIVar9->LogDenX) * ((pIVar4->XAxis).Range.Max - dVar7) +
                  dVar7) - dVar7) + (double)IVar2.x);
    if (1 < getter->Count) {
      iVar10 = 1;
      do {
        IVar13.x = (*getter->Getter)(getter->Data,iVar10);
        pIVar9 = GImPlot;
        dVar5 = log10((double)IVar13.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar4 = pIVar9->CurrentPlot;
        dVar7 = (pIVar4->XAxis).Range.Min;
        iVar3 = transformer->YAxis;
        IVar2 = pIVar9->PixelRange[iVar3].Min;
        fVar11 = (float)(pIVar9->Mx *
                         (((double)(float)(dVar5 / pIVar9->LogDenX) *
                           ((pIVar4->XAxis).Range.Max - dVar7) + dVar7) - dVar7) + (double)IVar2.x);
        fVar12 = (float)(pIVar9->My[iVar3] * (extraout_XMM1_Qa_00 - pIVar4->YAxis[iVar3].Range.Min)
                        + (double)IVar2.y);
        local_60.y = fVar12;
        local_60.x = fVar11;
        pIVar4 = pIVar8->CurrentPlot;
        fVar6 = (float)local_58._4_4_;
        if (fVar12 <= (float)local_58._4_4_) {
          fVar6 = fVar12;
        }
        if ((fVar6 < (pIVar4->PlotRect).Max.y) &&
           (fVar6 = (float)(~-(uint)(fVar12 <= (float)local_58._4_4_) & (uint)fVar12 |
                           local_58._4_4_ & -(uint)(fVar12 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar6 && fVar6 != *pfVar1)) {
          fVar6 = (float)local_58._0_4_;
          if (fVar11 <= (float)local_58._0_4_) {
            fVar6 = fVar11;
          }
          if ((fVar6 < (pIVar4->PlotRect).Max.x) &&
             (fVar6 = (float)(-(uint)(fVar11 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar11 <= (float)local_58._0_4_) & (uint)fVar11),
             (pIVar4->PlotRect).Min.x <= fVar6 && fVar6 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar10 = iVar10 + 1;
        local_58 = (undefined1  [8])local_60;
      } while (iVar10 < getter->Count);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}